

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::checkRemoveSamplerString(CLIntercept *this,cl_sampler sampler)

{
  cl_uint cVar1;
  cl_sampler local_20;
  
  local_20 = sampler;
  std::mutex::lock(&this->m_Mutex);
  cVar1 = getRefCount(this,sampler);
  if (cVar1 == 1) {
    std::
    _Rb_tree<_cl_sampler_*,_std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&(this->m_SamplerDataMap)._M_t,&local_20);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveSamplerString(
    cl_sampler sampler )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( sampler );
    if( refCount == 1 )
    {
        m_SamplerDataMap.erase( sampler );
    }
}